

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_libc.cc
# Opt level: O0

string * __thiscall
absl::time_internal::cctz::TimeZoneLibC::Description_abi_cxx11_
          (string *__return_storage_ptr__,TimeZoneLibC *this)

{
  char *__s;
  allocator<char> local_19;
  TimeZoneLibC *local_18;
  TimeZoneLibC *this_local;
  
  __s = "UTC";
  if ((this->local_ & 1U) != 0) {
    __s = "localtime";
  }
  local_18 = this;
  this_local = (TimeZoneLibC *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_19)
  ;
  std::allocator<char>::~allocator(&local_19);
  return __return_storage_ptr__;
}

Assistant:

std::string TimeZoneLibC::Description() const {
  return local_ ? "localtime" : "UTC";
}